

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O2

void __thiscall
stateObservation::
IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::writeInFile(IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *this,char *filename,bool clearLog,bool append)

{
  char cVar1;
  size_type sVar2;
  TimeIndex TVar3;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *this_00;
  Scalar *pSVar4;
  ostream *poVar5;
  runtime_error *this_01;
  Index col;
  long time;
  int i;
  long row;
  bool bVar6;
  runtime_error e;
  char *local_3d8 [4];
  ofstream f;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::ofstream::ofstream(&f);
  std::ofstream::open((char *)&f,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    sVar2 = std::
            deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::size(&this->v_);
    if (0 < (long)sVar2) {
      for (time = this->k_; TVar3 = getNextIndex(this), time < TVar3; time = time + 1) {
        std::ostream::_M_insert<long>((long)&f);
        this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                  operator[](this,time);
        for (row = 0; row < *(long *)(this_00 + 8); row = row + 1) {
          bVar6 = true;
          col = 0;
          while (bVar6) {
            std::operator<<((ostream *)&f," ");
            pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                               (this_00,row,col);
            bVar6 = false;
            std::ostream::_M_insert<double>(*pSVar4);
            col = 1;
          }
        }
        std::endl<char,std::char_traits<char>>((ostream *)&f);
      }
    }
    if (clearLog) {
      clear(this);
    }
    std::ofstream::~ofstream(&f);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar5 = std::operator<<(local_1a8,"Logger: File ");
  poVar5 = std::operator<<(poVar5,filename);
  std::operator<<(poVar5," could not be created/opened.");
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(&e,local_3d8[0]);
  std::__cxx11::string::~string((string *)local_3d8);
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,&e);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void IndexedMatrixArrayT<MatrixType, Allocator>::writeInFile(const char * filename, bool clearLog, bool append)
{
  std::ofstream f;
  if (!append)
  {
    f.open(filename);
  }
  else
  {
    f.open(filename,std::ofstream::app);
  }

  if (f.is_open())
  {
    if (size()>0)
    {

      for (TimeIndex k=getFirstIndex(); k<getNextIndex(); ++k)
      {

        f << k;

        MatrixType & m = operator[](k);

        for (int i = 0 ; i< m.rows(); ++i)
        {
          for (int j = 0 ; j< m.cols(); ++j)
          {
            f << " "<< m(i,j);
          }
        }
        f << std::endl;
      }
    }

    if (clearLog)
    {
      clear();
    }
  }
  else
  {
    std::stringstream ss;
    ss<< "Logger: File " <<filename<<" could not be created/opened.";
    std::runtime_error e(ss.str().c_str());
    throw e;
  }

}